

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrinsic_geometry_interface.cpp
# Opt level: O3

void __thiscall
geometrycentral::surface::IntrinsicGeometryInterface::computeFaceGalerkinMassMatrix
          (IntrinsicGeometryInterface *this)

{
  SparseMatrix<double,_0,_int> *dst;
  size_t __n;
  size_t sVar1;
  pointer puVar2;
  Index IVar3;
  Index IVar4;
  Index IVar5;
  Index IVar6;
  StorageIndex *pSVar7;
  StorageIndex *pSVar8;
  Scalar *pSVar9;
  StorageIndex *pSVar10;
  long lVar11;
  size_t sVar12;
  size_t sVar13;
  size_t i_1;
  SurfaceMesh *pSVar14;
  ActualDstType actualDst;
  vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_> triplets;
  size_t i;
  undefined1 local_99;
  void *local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  SparseMatrix<double,_0,_int> local_80;
  undefined8 local_38;
  
  if ((this->super_BaseGeometryInterface).faceIndicesQ.super_DependentQuantity.computed == false) {
    if ((this->super_BaseGeometryInterface).faceIndicesQ.super_DependentQuantity.evaluateFunc.
        super__Function_base._M_manager == (_Manager_type)0x0) goto LAB_001878a0;
    (*(this->super_BaseGeometryInterface).faceIndicesQ.super_DependentQuantity.evaluateFunc.
      _M_invoker)((_Any_data *)
                  &(this->super_BaseGeometryInterface).faceIndicesQ.super_DependentQuantity.
                   evaluateFunc);
    (this->super_BaseGeometryInterface).faceIndicesQ.super_DependentQuantity.computed = true;
  }
  if ((this->faceAreasQ).super_DependentQuantity.computed == false) {
    if ((this->faceAreasQ).super_DependentQuantity.evaluateFunc.super__Function_base._M_manager ==
        (_Manager_type)0x0) {
LAB_001878a0:
      ::std::__throw_bad_function_call();
    }
    (*(this->faceAreasQ).super_DependentQuantity.evaluateFunc._M_invoker)
              ((_Any_data *)&(this->faceAreasQ).super_DependentQuantity.evaluateFunc);
    (this->faceAreasQ).super_DependentQuantity.computed = true;
  }
  local_88 = 0;
  local_98 = (void *)0x0;
  uStack_90 = 0;
  pSVar14 = (this->super_BaseGeometryInterface).mesh;
  sVar1 = pSVar14->nFacesFillCount;
  if ((sVar1 == 0) ||
     (puVar2 = (pSVar14->fHalfedgeArr).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start, *puVar2 != 0xffffffffffffffff)) {
    sVar13 = 0;
  }
  else {
    sVar13 = 0;
    do {
      if (sVar1 - 1 == sVar13) goto LAB_00187722;
      lVar11 = sVar13 + 1;
      sVar13 = sVar13 + 1;
    } while (puVar2[lVar11] == 0xffffffffffffffff);
  }
  if (sVar13 != sVar1) {
    do {
      local_80._0_8_ =
           (this->super_BaseGeometryInterface).faceIndices.data.
           super_PlainObjectBase<Eigen::Matrix<unsigned_long,__1,_1,_0,__1,_1>_>.m_storage.m_data
           [sVar13];
      ::std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>::
      emplace_back<unsigned_long&,unsigned_long&,double&>
                ((vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>> *)
                 &local_98,(unsigned_long *)&local_80,(unsigned_long *)&local_80,
                 (this->faceAreas).data.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
                 sVar13);
      sVar12 = sVar13;
      do {
        if (sVar1 - 1 == sVar12) goto LAB_0018771e;
        sVar13 = sVar12 + 1;
        lVar11 = sVar12 + 1;
        sVar12 = sVar13;
      } while ((pSVar14->fHalfedgeArr).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[lVar11] == 0xffffffffffffffff);
    } while (sVar1 != sVar13);
LAB_0018771e:
    pSVar14 = (this->super_BaseGeometryInterface).mesh;
  }
LAB_00187722:
  local_80._0_8_ = local_80._0_8_ & 0xffffffffffffff00;
  local_80.m_outerSize = 0;
  local_80.m_innerSize = 0;
  local_80.m_outerIndex = (StorageIndex *)0x0;
  local_80.m_innerNonZeros = (StorageIndex *)0x0;
  local_80.m_data.m_values = (Scalar *)0x0;
  local_80.m_data.m_indices = (StorageIndex *)0x0;
  local_80.m_data.m_size = 0;
  local_80.m_data.m_allocatedSize = 0;
  Eigen::SparseMatrix<double,_0,_int>::resize(&local_80,pSVar14->nFacesCount,pSVar14->nFacesCount);
  dst = &this->faceGalerkinMassMatrix;
  if (local_80.super_SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>.
      super_SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>.m_isRValue == true) {
    IVar3 = (this->faceGalerkinMassMatrix).m_outerSize;
    IVar4 = (this->faceGalerkinMassMatrix).m_innerSize;
    (this->faceGalerkinMassMatrix).m_outerSize = local_80.m_outerSize;
    (this->faceGalerkinMassMatrix).m_innerSize = local_80.m_innerSize;
    pSVar7 = (this->faceGalerkinMassMatrix).m_outerIndex;
    pSVar8 = (this->faceGalerkinMassMatrix).m_innerNonZeros;
    pSVar9 = (this->faceGalerkinMassMatrix).m_data.m_values;
    pSVar10 = (this->faceGalerkinMassMatrix).m_data.m_indices;
    (this->faceGalerkinMassMatrix).m_outerIndex = local_80.m_outerIndex;
    (this->faceGalerkinMassMatrix).m_innerNonZeros = local_80.m_innerNonZeros;
    (this->faceGalerkinMassMatrix).m_data.m_values = local_80.m_data.m_values;
    (this->faceGalerkinMassMatrix).m_data.m_indices = local_80.m_data.m_indices;
    IVar5 = (this->faceGalerkinMassMatrix).m_data.m_size;
    IVar6 = (this->faceGalerkinMassMatrix).m_data.m_allocatedSize;
    (this->faceGalerkinMassMatrix).m_data.m_size = local_80.m_data.m_size;
    (this->faceGalerkinMassMatrix).m_data.m_allocatedSize = local_80.m_data.m_allocatedSize;
    local_80.m_outerSize = IVar3;
    local_80.m_innerSize = IVar4;
    local_80.m_outerIndex = pSVar7;
    local_80.m_innerNonZeros = pSVar8;
    local_80.m_data.m_values = pSVar9;
    local_80.m_data.m_indices = pSVar10;
    local_80.m_data.m_size = IVar5;
    local_80.m_data.m_allocatedSize = IVar6;
  }
  else if (dst != &local_80) {
    Eigen::SparseMatrix<double,0,int>::initAssignment<Eigen::SparseMatrix<double,0,int>>
              ((SparseMatrix<double,0,int> *)dst,&local_80);
    if (local_80.m_innerNonZeros == (StorageIndex *)0x0) {
      __n = (this->faceGalerkinMassMatrix).m_outerSize * 4 + 4;
      if (__n != 0) {
        memcpy((this->faceGalerkinMassMatrix).m_outerIndex,local_80.m_outerIndex,__n);
      }
      Eigen::internal::CompressedStorage<double,_int>::operator=
                (&(this->faceGalerkinMassMatrix).m_data,&local_80.m_data);
    }
    else {
      Eigen::internal::
      assign_sparse_to_sparse<Eigen::SparseMatrix<double,0,int>,Eigen::SparseMatrix<double,0,int>>
                (dst,&local_80);
    }
  }
  free(local_80.m_outerIndex);
  free(local_80.m_innerNonZeros);
  Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage(&local_80.m_data);
  local_80._0_8_ = local_98;
  local_38 = uStack_90;
  Eigen::internal::
  set_from_triplets<__gnu_cxx::__normal_iterator<Eigen::Triplet<double,int>*,std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>>,Eigen::SparseMatrix<double,0,int>,Eigen::internal::scalar_sum_op<double,double>>
            (&local_80,&local_38,dst,&local_99);
  if (local_98 != (void *)0x0) {
    operator_delete(local_98);
  }
  return;
}

Assistant:

void IntrinsicGeometryInterface::computeFaceGalerkinMassMatrix() {
  faceIndicesQ.ensureHave();
  faceAreasQ.ensureHave();

  std::vector<Eigen::Triplet<double>> triplets;
  for (Face f : mesh.faces()) {
    size_t i = faceIndices[f];
    triplets.emplace_back(i, i, faceAreas[f]);
  }

  faceGalerkinMassMatrix = Eigen::SparseMatrix<double>(mesh.nFaces(), mesh.nFaces());
  faceGalerkinMassMatrix.setFromTriplets(triplets.begin(), triplets.end());
}